

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

int getopts(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char local_48 [4];
  int opt;
  bsdunzip bsdunzip_storage;
  bsdunzip *bsdunzip;
  char **argv_local;
  int argc_local;
  
  bsdunzip_optind = 1;
  bsdunzip_storage.argument = local_48;
  memset(bsdunzip_storage.argument,0,0x28);
  *(char ***)(bsdunzip_storage.argument + 0x18) = argv;
  *(int *)(bsdunzip_storage.argument + 0x10) = argc;
  do {
    iVar1 = bsdunzip_getopt((bsdunzip *)bsdunzip_storage.argument);
    if (iVar1 == -1) {
      return bsdunzip_optind;
    }
    unzip_exclude_mode = 0;
    switch(iVar1) {
    case 0:
      break;
    case 1:
      version_opt = 1;
      break;
    default:
      usage();
      break;
    case 0x43:
      C_opt = 1;
      break;
    case 0x49:
    case 0x4f:
      O_arg = *(char **)(bsdunzip_storage.argument + 0x20);
      break;
    case 0x4c:
      L_opt = 1;
      break;
    case 0x50:
      P_arg = *(char **)(bsdunzip_storage.argument + 0x20);
      break;
    case 0x5a:
      zipinfo_mode = 1;
      if ((*(long *)(bsdunzip_storage.argument + 0x20) != 0) &&
         (iVar2 = strcmp(*(char **)(bsdunzip_storage.argument + 0x20),"1"), iVar2 == 0)) {
        Z1_opt = 1;
      }
      break;
    case 0x61:
      a_opt = 1;
      break;
    case 99:
      c_opt = 1;
      break;
    case 100:
      d_arg = *(char **)(bsdunzip_storage.argument + 0x20);
      break;
    case 0x66:
      f_opt = 1;
      break;
    case 0x6a:
      j_opt = 1;
      break;
    case 0x6c:
      if (v_opt == 0) {
        v_opt = 1;
      }
      break;
    case 0x6e:
      n_opt = 1;
      break;
    case 0x6f:
      o_opt = 1;
      q_opt = 1;
      break;
    case 0x70:
      p_opt = 1;
      break;
    case 0x71:
      q_opt = 1;
      break;
    case 0x74:
      t_opt = 1;
      break;
    case 0x75:
      u_opt = 1;
      break;
    case 0x76:
      v_opt = 2;
      break;
    case 0x78:
      add_pattern(&exclude,*(char **)(bsdunzip_storage.argument + 0x20));
      unzip_exclude_mode = 1;
      break;
    case 0x79:
      y_str = "  ";
    }
  } while (iVar1 != 0);
  return bsdunzip_optind;
}

Assistant:

static int
getopts(int argc, char *argv[])
{
	struct bsdunzip *bsdunzip, bsdunzip_storage;
	int opt;
	bsdunzip_optind = 1;

	bsdunzip = &bsdunzip_storage;
	memset(bsdunzip, 0, sizeof(*bsdunzip));

        bsdunzip->argv = argv;
        bsdunzip->argc = argc;

	while ((opt = bsdunzip_getopt(bsdunzip)) != -1) {
		unzip_exclude_mode = 0;
		switch (opt) {
		case 'a':
			a_opt = 1;
			break;
		case 'C':
			C_opt = 1;
			break;
		case 'c':
			c_opt = 1;
			break;
		case 'd':
			d_arg = bsdunzip->argument;
			break;
		case 'f':
			f_opt = 1;
			break;
		case 'I':
		case 'O':
			O_arg = bsdunzip->argument;
			break;
		case 'j':
			j_opt = 1;
			break;
		case 'L':
			L_opt = 1;
			break;
		case 'l':
			if (v_opt == 0)
				v_opt = 1;
			break;
		case 'n':
			n_opt = 1;
			break;
		case 'o':
			o_opt = 1;
			q_opt = 1;
			break;
		case 'p':
			p_opt = 1;
			break;
		case 'P':
			P_arg = bsdunzip->argument;
			break;
		case 'q':
			q_opt = 1;
			break;
		case 't':
			t_opt = 1;
			break;
		case 'u':
			u_opt = 1;
			break;
		case 'v':
			v_opt = 2;
			break;
		case 'x':
			add_pattern(&exclude, bsdunzip->argument);
			unzip_exclude_mode = 1;
			break;
		case 'y':
			y_str = "  ";
			break;
		case 'Z':
			zipinfo_mode = 1;
			if (bsdunzip->argument != NULL &&
			    strcmp(bsdunzip->argument, "1") == 0) {
				Z1_opt = 1;
			}
			break;
		case OPTION_VERSION:
			version_opt = 1;
			break;
		case OPTION_NONE:
			break;
		default:
			usage();
		}
		if (opt == OPTION_NONE)
			break;
	}
	return (bsdunzip_optind);
}